

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_kaku.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte *data;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  byte extraout_var;
  int *piVar8;
  byte bVar9;
  char *pcVar10;
  rf_dev_t *data_00;
  int *__s1;
  rf_dev_t *spi_path;
  rf_dev_t dev;
  char *tmp;
  byte bStack_69;
  ulong uStack_68;
  char *pcStack_60;
  ulong uStack_58;
  code *pcStack_50;
  rf_dev_t rStack_48;
  char *local_40;
  uint8_t local_34;
  undefined1 local_33;
  undefined1 local_32;
  byte local_31;
  
  data_00 = &rStack_48;
  pcVar10 = "/dev/spidev0.0";
  do {
    spi_path = (rf_dev_t *)pcVar10;
    pcStack_50 = (code *)0x10152e;
    iVar2 = __posix_getopt(argc,argv,"d:h");
    pcVar10 = _optarg;
  } while (iVar2 == 100);
  if (iVar2 == -1) {
    if (argc - _optind != 3) goto LAB_001016a1;
    pcStack_50 = (code *)0x10156e;
    uVar5 = strtol(argv[_optind],&local_40,0x10);
    if (*local_40 != '\0') goto LAB_001016a9;
    lVar6 = (long)_optind;
    _optind = _optind + 1;
    pcStack_50 = (code *)0x10159c;
    uVar7 = strtol(argv[lVar6 + 1],&local_40,0);
    if (*local_40 != '\0') goto LAB_001016ae;
    if ((uVar7 & 0xfffffff0) == 0) {
      lVar6 = (long)_optind;
      _optind = _optind + 1;
      __s1 = (int *)argv[lVar6 + 1];
      pcStack_50 = (code *)0x1015d8;
      uVar3 = strcmp((char *)__s1,"on");
      if (uVar3 != 0) {
        pcVar10 = "off";
        pcStack_50 = (code *)0x1015ed;
        iVar2 = strcmp((char *)__s1,"off");
        if (iVar2 != 0) goto LAB_001016d3;
      }
      pcStack_50 = (code *)0x101600;
      iVar2 = rf_open(&rStack_48,(char *)spi_path);
      if (iVar2 == 0) {
        pcStack_50 = (code *)0x101628;
        iVar2 = rf_config(&rStack_48,433.92,0.0,1,26.666666666666668);
        if (iVar2 == 0) {
          local_34 = (uint8_t)(uVar5 >> 0x12);
          local_33 = (undefined1)(uVar5 >> 10);
          local_32 = (undefined1)(uVar5 >> 2);
          bVar9 = (char)uVar5 * '@';
          data_00 = (rf_dev_t *)&local_34;
          local_31 = bVar9 + 0x10;
          if (uVar3 != 0) {
            local_31 = bVar9;
          }
          local_31 = (byte)uVar7 | local_31;
          uVar7 = CONCAT71((int7)(uVar7 >> 8),local_31);
          pcStack_50 = (code *)0x101670;
          uVar4 = kaku_send(&rStack_48,(uint8_t *)data_00);
          uVar5 = (ulong)uVar4;
          pcStack_50 = (code *)0x10167a;
          rf_close(&rStack_48);
          spi_path = &rStack_48;
          if (uVar4 == 0) {
            return 0;
          }
        }
        else {
          pcStack_50 = (code *)0x1016cc;
          main_cold_7();
        }
        __s1 = (int *)(uVar5 & 0xffffffff);
        pcStack_50 = (code *)0x1016d3;
        main_cold_8();
        pcVar10 = (char *)data_00;
LAB_001016d3:
        pcStack_50 = rf_open;
        main_cold_6();
        uStack_68 = uVar5;
        pcStack_60 = (char *)spi_path;
        uStack_58 = uVar7;
        pcStack_50 = (code *)(ulong)uVar3;
        bStack_69 = extraout_var;
        iVar2 = open(pcVar10,2);
        if (iVar2 == -1) {
          iVar2 = 0x10010001;
        }
        else {
          *__s1 = iVar2;
          iVar2 = spi_read_reg(iVar2,'\x10',&bStack_69);
          if ((iVar2 == 0) && (iVar2 = 0x20001, (bStack_69 & 0xf0) == 0x20)) {
            data = (byte *)(__s1 + 1);
            iVar2 = spi_read_reg(*__s1,'<',data);
            if (iVar2 == 0) {
              *data = *data & 0x7f;
              iVar2 = 0;
            }
            if (iVar2 == 0) {
              return 0;
            }
          }
          piVar8 = __errno_location();
          iVar1 = *piVar8;
          close(*__s1);
          *__s1 = -1;
          *piVar8 = iVar1;
        }
        return iVar2;
      }
      goto LAB_001016b8;
    }
  }
  else {
    if (iVar2 == 0x68) {
      pcStack_50 = (code *)0x10169c;
      main_cold_1();
    }
    pcStack_50 = (code *)0x1016a1;
    main_cold_9();
LAB_001016a1:
    pcStack_50 = (code *)0x1016a9;
    main_cold_2();
LAB_001016a9:
    pcStack_50 = (code *)0x1016ae;
    main_cold_3();
LAB_001016ae:
    pcStack_50 = (code *)0x1016b3;
    main_cold_4();
  }
  pcStack_50 = (code *)0x1016b8;
  main_cold_5();
LAB_001016b8:
  pcStack_50 = (code *)0x1016c2;
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
	int opt;
	const char *dev_path = DEFAULT_DEV_PATH;
	rf_dev_t dev;
	unsigned char kaku_data[4];
	enum { ButtonOn, ButtonOff } button;
	char *tmp;
	uint32_t addr;
	int unit;
	int ret;

	while ((opt = getopt(argc, argv, "d:h")) != -1) {
		switch (opt) {
		case 'd':
			dev_path = optarg;
			break;
		case 'h':
			usage(argv[0]);
			exit(EXIT_SUCCESS);
			break;
		default: /* '?' */
			usage(argv[0]);
			exit(EXIT_FAILURE);
		}
	}
	
	if (argc - optind != 3) {
		fprintf(stderr, "Incorrect amount of arguments\n");
		usage(argv[0]);
		exit(EXIT_FAILURE);
	}

	addr = strtol(argv[optind], &tmp, 16);
	if (*tmp != '\0') {
		fprintf(stderr, "Unparsable characters in address argument\n");
		exit(EXIT_FAILURE);
	}
	optind++;

	unit = strtol(argv[optind], &tmp, 0);
	if (*tmp != '\0') {
		fprintf(stderr, "Unparsable characters in unit argument\n");
		exit(EXIT_FAILURE);
	}
	if (unit > 0xf || unit < 0) {
		fprintf(stderr, "Unit number out of range(0-15)\n");
		exit(EXIT_FAILURE);
	}
	optind++;

	if (strcmp(argv[optind], "on") == 0) {
		button = ButtonOn;
	} else if (strcmp(argv[optind], "off") == 0) {
		button = ButtonOff;
	} else {
		fprintf(stderr, "Unknown direction argument\n");
		exit(EXIT_FAILURE);
	}

	// Open SX1231
	if (rf_open(&dev, dev_path) != 0) {
		exit(EXIT_FAILURE);
	}

	ret = rf_config(&dev, 433.92, 0, SX1231_MODULATION_OOK, ENCODED_BITRATE);
	if (ret != ERR_OK) {
		fprintf(stderr, "ERROR: Failed configuring module: %d\n", ret);
		rf_close(&dev);
		exit(EXIT_FAILURE);
	}

	// encode KAKU frame data
	kaku_data[0] = addr >> 18;
	kaku_data[1] = addr >> 10;
	kaku_data[2] = addr >> 2;
	kaku_data[3] = (addr << 6) & 0xc0;
	if (button == ButtonOn) {
		kaku_data[3] |= 0x10;
	} else {
		kaku_data[3] &= ~0x10;
	}
	kaku_data[3] = (kaku_data[3] & 0xF0) | (unit & 0x0F);

	// send frame
	ret = kaku_send(&dev, kaku_data);

	rf_close(&dev);

	if (ret != ERR_OK) {
		fprintf(stderr, "ERROR: Failed sending command: %d\n", ret);
		exit(EXIT_FAILURE);
	}

	return EXIT_SUCCESS;
}